

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void __thiscall xLearn::AUCMetric::Reset(AUCMetric *this)

{
  size_type in_stack_00000018;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000020;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2365ab);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2365b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_stack_00000020,in_stack_00000018,(value_type_conflict2 *)this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_stack_00000020,in_stack_00000018,(value_type_conflict2 *)this);
  return;
}

Assistant:

void Reset() {
    all_positive_number_.clear();
    all_negative_number_.clear();
    all_positive_number_.resize(kMaxBucketSize, 0);
    all_negative_number_.resize(kMaxBucketSize, 0);
  }